

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementImpl.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DOMElementImpl::release(DOMElementImpl *this)

{
  ushort uVar1;
  DOMDocument *pDVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DOMException *this_00;
  undefined4 extraout_var_01;
  undefined8 *puVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  
  uVar1 = (this->fNode).flags;
  if (((uVar1 & 8) == 0) || ((uVar1 & 0x1000) != 0)) {
    pDVar2 = (this->fParent).fOwnerDocument;
    if (pDVar2 != (DOMDocument *)0x0) {
      DOMNodeImpl::callUserDataHandlers(&this->fNode,NODE_DELETED,(DOMNode *)0x0,(DOMNode *)0x0);
      DOMParentNode::release(&this->fParent);
      (*(this->fAttributes->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xd])(this->fAttributes,0);
      while( true ) {
        iVar3 = (*(this->fAttributes->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[5])();
        if (CONCAT44(extraout_var,iVar3) == 0) break;
        iVar3 = (*(this->fAttributes->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0x10])
                          (this->fAttributes,CONCAT44(extraout_var,iVar3) + -1);
        (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x138))
                  ((long *)CONCAT44(extraout_var_00,iVar3));
      }
      (*pDVar2[-1].super_DOMNode._vptr_DOMNode[6])(&pDVar2[-1].super_DOMNode,this,6);
      return;
    }
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar3 = (*(this->super_DOMElement).super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_01,iVar3) == 0) {
      puVar4 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar3 = (*(this->super_DOMElement).super_DOMNode._vptr_DOMNode[0xc])(this);
      puVar4 = (undefined8 *)(CONCAT44(extraout_var_03,iVar3) + 0x158);
    }
    DOMException::DOMException(this_00,0xf,0,(MemoryManager *)*puVar4);
  }
  else {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar3 = (*(this->super_DOMElement).super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_02,iVar3) == 0) {
      puVar4 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar3 = (*(this->super_DOMElement).super_DOMNode._vptr_DOMNode[0xc])(this);
      puVar4 = (undefined8 *)(CONCAT44(extraout_var_04,iVar3) + 0x158);
    }
    DOMException::DOMException(this_00,0xf,0,(MemoryManager *)*puVar4);
  }
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMElementImpl::release()
{
    if (fNode.isOwned() && !fNode.isToBeReleased())
        throw DOMException(DOMException::INVALID_ACCESS_ERR,0, GetDOMNodeMemoryManager);

    DOMDocumentImpl* doc = (DOMDocumentImpl*) fParent.fOwnerDocument;
    if (doc) {
        fNode.callUserDataHandlers(DOMUserDataHandler::NODE_DELETED, 0, 0);
        // release children
        fParent.release();
        // release attributes
        fAttributes->hasDefaults(false);
        XMLSize_t count;
        while((count = fAttributes->getLength()) != 0)
        {
            DOMNode* attr = fAttributes->removeNamedItemAt(count-1);
            attr->release();
        }

        doc->release(this, DOMMemoryManager::ELEMENT_OBJECT);
    }
    else {
        // shouldn't reach here
        throw DOMException(DOMException::INVALID_ACCESS_ERR,0, GetDOMNodeMemoryManager);
    }
}